

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O1

void print_voice_list(OpenJTalk *openjtalk)

{
  long *plVar1;
  size_t sVar2;
  HtsVoiceFilelist *list;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  char padding [260];
  char local_138 [264];
  
  plVar1 = (long *)openjtalk_getHTSVoiceList();
  if (plVar1 == (long *)0x0) {
    lVar5 = 4;
  }
  else {
    uVar4 = 0;
    plVar6 = plVar1;
    do {
      sVar2 = strlen((char *)plVar6[2]);
      if (sVar2 < uVar4) {
        sVar2 = uVar4;
      }
      plVar6 = (long *)*plVar6;
      uVar4 = sVar2;
    } while (plVar6 != (long *)0x0);
    lVar5 = (sVar2 & 0xfffffffffffffffc) + 4;
  }
  if (plVar1 != (long *)0x0) {
    do {
      sVar2 = strlen((char *)plVar1[2]);
      local_138[0] = ' ';
      local_138[1] = '\0';
      if (~sVar2 + lVar5 != 0) {
        lVar3 = sVar2 + (1 - lVar5);
        do {
          sVar2 = strlen(local_138);
          (local_138 + sVar2)[0] = ' ';
          (local_138 + sVar2)[1] = '\0';
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0);
      }
      printf("%s%s%s\n",plVar1[2],local_138,plVar1[1]);
      plVar1 = (long *)*plVar1;
    } while (plVar1 != (long *)0x0);
  }
  return;
}

Assistant:

void print_voice_list(OpenJTalk *openjtalk)
{
	char padding[MAX_PATH];
	HtsVoiceFilelist *result = openjtalk_getHTSVoiceList(openjtalk);
	size_t length = 0;

	for (HtsVoiceFilelist*list = result; list != NULL; list = list->succ)
	{
		size_t len = strlen(list->name);
		if (length < len)
		{
			length = len;
		}
	}
	int tab_len = 4;
	length = (length / tab_len) * tab_len + tab_len;
	for (HtsVoiceFilelist*list = result; list != NULL; list = list->succ)
	{
		size_t diff = length - strlen((char*)list->name);
		strcpy(padding, " ");
		while (--diff)
		{
			strcat(padding, " ");
		}
		printf("%s%s%s\n", (char*)list->name, padding, (char*)list->path);
	}
}